

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbs(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *__return_storage_ptr__,
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  undefined4 uVar1;
  pointer pnVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  _Var8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  __it2;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  __it1;
  undefined1 local_29;
  
  _Var8._M_current =
       (this->val).
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = (this->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __it2._M_current = _Var8._M_current + 1;
  if (__it2._M_current != pnVar2 && _Var8._M_current != pnVar2) {
    __it1._M_current = _Var8._M_current;
    do {
      bVar7 = __gnu_cxx::__ops::
              _Iter_comp_iter<soplex::VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::maxAbs()const::{lambda(boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>)#1}>
              ::operator()(&local_29,__it1,__it2);
      _Var8._M_current = __it2._M_current;
      if (!bVar7) {
        _Var8._M_current = __it1._M_current;
      }
      __it2._M_current = __it2._M_current + 1;
      __it1._M_current = _Var8._M_current;
    } while (__it2._M_current != pnVar2);
  }
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       *(undefined8 *)(((_Var8._M_current)->m_backend).data._M_elems + 8);
  uVar4 = *(undefined8 *)((_Var8._M_current)->m_backend).data._M_elems;
  uVar5 = *(undefined8 *)(((_Var8._M_current)->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)(((_Var8._M_current)->m_backend).data._M_elems + 6);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       *(undefined8 *)(((_Var8._M_current)->m_backend).data._M_elems + 4);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar6;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar4;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar5;
  bVar7 = ((_Var8._M_current)->m_backend).neg;
  (__return_storage_ptr__->m_backend).exp = ((_Var8._M_current)->m_backend).exp;
  (__return_storage_ptr__->m_backend).neg = bVar7;
  uVar1 = ((_Var8._M_current)->m_backend).fpclass;
  uVar3 = ((_Var8._M_current)->m_backend).prec_elem;
  (__return_storage_ptr__->m_backend).fpclass = uVar1;
  (__return_storage_ptr__->m_backend).prec_elem = uVar3;
  if ((bVar7 == true) && (uVar1 != 0 || (__return_storage_ptr__->m_backend).data._M_elems[0] != 0))
  {
    (__return_storage_ptr__->m_backend).neg = false;
  }
  return __return_storage_ptr__;
}

Assistant:

R maxAbs() const
   {
      assert(dim() > 0);

      // A helper function for the std::max_element. Because we compare the absolute value.
      auto absCmpr = [](R a, R b)
      {
         return (spxAbs(a) < spxAbs(b));
      };

      auto maxReference = std::max_element(val.begin(), val.end(), absCmpr);

      R maxi = spxAbs(*maxReference);

      assert(maxi >= 0.0);

      return maxi;
   }